

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O1

ostream * PyreNet::operator<<(ostream *os,NeuralNet *nn)

{
  Layer *pLVar1;
  ostream *poVar2;
  Layer *l;
  Layer *l_00;
  
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,nn->inputSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  pLVar1 = (nn->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (l_00 = (nn->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
              _M_impl.super__Vector_impl_data._M_start; l_00 != pLVar1; l_00 = l_00 + 1) {
    poVar2 = operator<<(os,l_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const NeuralNet& nn) {
        os << nn.inputSize << " ";
        os << nn.layers.size() << " ";
        for (const Layer& l : nn.layers)
            os << l << " ";
        return os;
    }